

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall RefundIRCCommand::create(RefundIRCCommand *this)

{
  Jupiter::Command::addTrigger(this,6,"refund");
  Jupiter::Command::addTrigger(this,0xb,"givecredits");
  Jupiter::Command::addTrigger(this,2,"gc");
  Jupiter::Command::addTrigger(this,5,"money");
  Jupiter::Command::addTrigger(this,7,"credits");
  IRCCommand::setAccessLevel((int)this);
  return;
}

Assistant:

void RefundIRCCommand::create() {
	this->addTrigger("refund"sv);
	this->addTrigger("givecredits"sv);
	this->addTrigger("gc"sv);
	this->addTrigger("money"sv);
	this->addTrigger("credits"sv);
	this->setAccessLevel(3);
}